

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonValidFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonParse *pJVar1;
  JsonParse *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  pJVar1 = jsonParseCached(ctx,argv,(sqlite3_context *)0x0);
  sqlite3_result_int(ctx,(uint)(pJVar1 != (JsonParse *)0x0));
  return;
}

Assistant:

static void jsonValidFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  UNUSED_PARAM(argc);
  p = jsonParseCached(ctx, argv, 0);
  sqlite3_result_int(ctx, p!=0);
}